

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O0

int deflatePrime(z_streamp strm,int bits,int value)

{
  deflate_state *s_00;
  int iVar1;
  int local_2c;
  int put;
  deflate_state *s;
  int value_local;
  int bits_local;
  z_streamp strm_local;
  
  iVar1 = deflateStateCheck(strm);
  if (iVar1 == 0) {
    s_00 = strm->state;
    if (((bits < 0) || (0x10 < bits)) ||
       (s._0_4_ = value, s._4_4_ = bits, s_00->d_buf < s_00->pending_out + 2)) {
      strm_local._4_4_ = -5;
    }
    else {
      do {
        local_2c = 0x10 - s_00->bi_valid;
        if (s._4_4_ < local_2c) {
          local_2c = s._4_4_;
        }
        s_00->bi_buf = s_00->bi_buf |
                       (ushort)(((uint)s & (1 << ((byte)local_2c & 0x1f)) - 1U) <<
                               ((byte)s_00->bi_valid & 0x1f));
        s_00->bi_valid = local_2c + s_00->bi_valid;
        _tr_flush_bits(s_00);
        s._0_4_ = (int)(uint)s >> ((byte)local_2c & 0x1f);
        s._4_4_ = s._4_4_ - local_2c;
      } while (s._4_4_ != 0);
      strm_local._4_4_ = 0;
    }
  }
  else {
    strm_local._4_4_ = -2;
  }
  return strm_local._4_4_;
}

Assistant:

int ZEXPORT deflatePrime(z_streamp strm, int bits, int value) {
    deflate_state *s;
    int put;

    if (deflateStateCheck(strm)) return Z_STREAM_ERROR;
    s = strm->state;
#ifdef LIT_MEM
    if (bits < 0 || bits > 16 ||
        (uchf *)s->d_buf < s->pending_out + ((Buf_size + 7) >> 3))
        return Z_BUF_ERROR;
#else
    if (bits < 0 || bits > 16 ||
        s->sym_buf < s->pending_out + ((Buf_size + 7) >> 3))
        return Z_BUF_ERROR;
#endif
    do {
        put = Buf_size - s->bi_valid;
        if (put > bits)
            put = bits;
        s->bi_buf |= (ush)((value & ((1 << put) - 1)) << s->bi_valid);
        s->bi_valid += put;
        _tr_flush_bits(s);
        value >>= put;
        bits -= put;
    } while (bits);
    return Z_OK;
}